

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Displacement.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::DisplacementZ::calcCorrValImpl
          (Vector3d *__return_storage_ptr__,DisplacementZ *this,int frame1,int frame2,int id1,
          int id2,int timeBin)

{
  int *piVar1;
  int iVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dStack_28;
  Vector<double,_3U> result;
  
  pvVar3 = (this->zBins_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = *(int *)(*(long *)&pvVar3[frame1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (long)id1 * 4);
  if (iVar2 == *(int *)(*(long *)&pvVar3[frame2].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + (long)id2 * 4)) {
    pvVar4 = (this->positions_).
             super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = *(long *)&pvVar4[frame2].
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar6 = *(long *)&pvVar4[frame1].
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data;
    result.data_[0] = 0.0;
    result.data_[1] = 0.0;
    lVar7 = 0;
    do {
      result.data_[lVar7 + -1] =
           *(double *)((long)id2 * 0x18 + lVar5 + lVar7 * 8) -
           *(double *)((long)id1 * 0x18 + lVar6 + lVar7 * 8);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar5 = (long)iVar2 * 0x18 +
            *(long *)&(this->histograms_).
                      super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[timeBin].
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar6 = 0;
    do {
      *(double *)(lVar5 + lVar6 * 8) = result.data_[lVar6 + -1] + *(double *)(lVar5 + lVar6 * 8);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    piVar1 = (int *)(*(long *)&(this->counts_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[timeBin].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (long)iVar2 * 4);
    *piVar1 = *piVar1 + 1;
  }
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Vector3d DisplacementZ::calcCorrValImpl(int frame1, int frame2, int id1,
                                          int id2, int timeBin) {
    int zBin1 = zBins_[frame1][id1];
    int zBin2 = zBins_[frame2][id2];

    if (zBin1 == zBin2) {
      Vector3d diff = positions_[frame2][id2] - positions_[frame1][id1];
      histograms_[timeBin][zBin1] += diff;
      counts_[timeBin][zBin1]++;
    }
    return Vector3d(0.0);
  }